

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialIntegerAttributeDecoder::DecodeIntegerValues
          (SequentialIntegerAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  PointAttribute *pPVar1;
  PredictionSchemeTypedDecoderInterface<int,_int> *pPVar2;
  __uniq_ptr_data<draco::DataBuffer,_std::default_delete<draco::DataBuffer>,_true,_true> _Var3;
  bool bVar4;
  char cVar5;
  uint num_components;
  int32_t iVar6;
  ulong uVar7;
  uint32_t *out_values;
  uint32_t *out_data;
  long lVar8;
  ulong uVar9;
  uint8_t num_bytes;
  uint8_t compressed;
  long local_40;
  uint32_t *local_38;
  
  num_components =
       (*(this->super_SequentialAttributeDecoder)._vptr_SequentialAttributeDecoder[0xb])();
  if ((int)num_components < 1) {
    return false;
  }
  lVar8 = (long)(point_ids->
                super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(point_ids->
                super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2;
  PreparePortableAttribute(this,(int)lVar8,num_components);
  pPVar1 = (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  if (pPVar1->num_unique_entries_ == 0) {
    return false;
  }
  out_values = (uint32_t *)
               (*(long *)(pPVar1->super_GeometryAttribute).buffer_ +
               (pPVar1->super_GeometryAttribute).byte_offset_);
  if (out_values == (uint32_t *)0x0) {
    return false;
  }
  bVar4 = DecoderBuffer::Decode<unsigned_char>(in_buffer,&compressed);
  if (!bVar4) {
    return false;
  }
  uVar9 = lVar8 * (ulong)num_components;
  if (compressed == '\0') {
    bVar4 = DecoderBuffer::Decode<unsigned_char>(in_buffer,&num_bytes);
    if (!bVar4) {
      return false;
    }
    local_40 = CONCAT44(local_40._4_4_,(uint)num_bytes);
    iVar6 = DataTypeLength(DT_INT32);
    _Var3.super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
    super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl =
         (((this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)->attribute_buffer_).
         _M_t.super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>;
    uVar7 = *(long *)((long)_Var3.
                            super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                            .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl + 8) -
            *(long *)_Var3.
                     super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                     .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
    if (iVar6 != (int)local_40) {
      if (uVar7 < num_bytes * uVar9) {
        return false;
      }
      if (in_buffer->data_size_ - in_buffer->pos_ < (long)(num_bytes * uVar9)) {
        return false;
      }
      lVar8 = uVar9 + 1;
      out_data = out_values;
      while (lVar8 + -1 != 0) {
        local_38 = out_data + 1;
        local_40 = lVar8 + -1;
        bVar4 = DecoderBuffer::Decode(in_buffer,out_data,(ulong)num_bytes);
        lVar8 = local_40;
        out_data = local_38;
        if (!bVar4) {
          return false;
        }
      }
      goto LAB_0013f3d7;
    }
    if (uVar7 < uVar9 * 4) {
      return false;
    }
    bVar4 = DecoderBuffer::Decode(in_buffer,out_values,uVar9 * 4);
  }
  else {
    bVar4 = DecodeSymbols((uint32_t)uVar9,num_components,in_buffer,out_values);
  }
  if (bVar4 == false) {
    return false;
  }
LAB_0013f3d7:
  if ((uVar9 != 0) &&
     ((pPVar2 = (this->prediction_scheme_)._M_t.
                super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                .
                super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
                ._M_head_impl, pPVar2 == (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0 ||
      (cVar5 = (**(code **)((long)(pPVar2->super_PredictionSchemeDecoderInterface).
                                  super_PredictionSchemeInterface + 0x40))(), cVar5 == '\0')))) {
    ConvertSymbolsToSignedInts(out_values,(uint32_t)uVar9,(int32_t *)out_values);
  }
  pPVar2 = (this->prediction_scheme_)._M_t.
           super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
           .super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>.
           _M_head_impl;
  if ((pPVar2 != (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0) &&
     ((cVar5 = (**(code **)((long)(pPVar2->super_PredictionSchemeDecoderInterface).
                                  super_PredictionSchemeInterface + 0x50))(pPVar2,in_buffer),
      cVar5 == '\0' ||
      ((uVar9 != 0 &&
       (pPVar2 = (this->prediction_scheme_)._M_t.
                 super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                 .
                 super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
                 ._M_head_impl,
       cVar5 = (**(code **)((long)(pPVar2->super_PredictionSchemeDecoderInterface).
                                  super_PredictionSchemeInterface + 0x58))
                         (pPVar2,out_values,out_values,uVar9 & 0xffffffff,num_components,
                          (point_ids->
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start), cVar5 == '\0')))))) {
    return false;
  }
  return true;
}

Assistant:

bool SequentialIntegerAttributeDecoder::DecodeIntegerValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  const int num_components = GetNumValueComponents();
  if (num_components <= 0) {
    return false;
  }
  const size_t num_entries = point_ids.size();
  const size_t num_values = num_entries * num_components;
  PreparePortableAttribute(static_cast<int>(num_entries), num_components);
  int32_t *const portable_attribute_data = GetPortableAttributeData();
  if (portable_attribute_data == nullptr) {
    return false;
  }
  uint8_t compressed;
  if (!in_buffer->Decode(&compressed)) {
    return false;
  }
  if (compressed > 0) {
    // Decode compressed values.
    if (!DecodeSymbols(static_cast<uint32_t>(num_values), num_components,
                       in_buffer,
                       reinterpret_cast<uint32_t *>(portable_attribute_data))) {
      return false;
    }
  } else {
    // Decode the integer data directly.
    // Get the number of bytes for a given entry.
    uint8_t num_bytes;
    if (!in_buffer->Decode(&num_bytes)) {
      return false;
    }
    if (num_bytes == DataTypeLength(DT_INT32)) {
      if (portable_attribute()->buffer()->data_size() <
          sizeof(int32_t) * num_values) {
        return false;
      }
      if (!in_buffer->Decode(portable_attribute_data,
                             sizeof(int32_t) * num_values)) {
        return false;
      }
    } else {
      if (portable_attribute()->buffer()->data_size() <
          num_bytes * num_values) {
        return false;
      }
      if (in_buffer->remaining_size() <
          static_cast<int64_t>(num_bytes) * static_cast<int64_t>(num_values)) {
        return false;
      }
      for (size_t i = 0; i < num_values; ++i) {
        if (!in_buffer->Decode(portable_attribute_data + i, num_bytes)) {
          return false;
        }
      }
    }
  }

  if (num_values > 0 && (prediction_scheme_ == nullptr ||
                         !prediction_scheme_->AreCorrectionsPositive())) {
    // Convert the values back to the original signed format.
    ConvertSymbolsToSignedInts(
        reinterpret_cast<const uint32_t *>(portable_attribute_data),
        static_cast<int>(num_values), portable_attribute_data);
  }

  // If the data was encoded with a prediction scheme, we must revert it.
  if (prediction_scheme_) {
    if (!prediction_scheme_->DecodePredictionData(in_buffer)) {
      return false;
    }

    if (num_values > 0) {
      if (!prediction_scheme_->ComputeOriginalValues(
              portable_attribute_data, portable_attribute_data,
              static_cast<int>(num_values), num_components, point_ids.data())) {
        return false;
      }
    }
  }
  return true;
}